

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

double __thiscall
CBlockPolicyEstimator::estimateCombinedFee
          (CBlockPolicyEstimator *this,uint confTarget,double successThreshold,
          bool checkShorterHorizon,EstimationResult *result)

{
  TxConfirmStats *pTVar1;
  uint uVar2;
  long lVar3;
  EstimationResult *pEVar4;
  TxConfirmStats *this_00;
  EstimationResult *pEVar5;
  long in_FS_OFFSET;
  byte bVar6;
  double dVar7;
  double dVar8;
  EstimationResult local_a8;
  long local_30;
  
  bVar6 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  dVar7 = -1.0;
  if ((confTarget != 0) &&
     (pTVar1 = (this->longStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,
     confTarget <=
     (int)(((long)*(pointer *)
                   ((long)&(pTVar1->confAvg).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   + 8) -
           *(long *)&(pTVar1->confAvg).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl) / 0x18) * pTVar1->scale)) {
    this_00 = (this->shortStats)._M_t.
              super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
              super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
              super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    if ((int)(((long)*(pointer *)
                      ((long)&(this_00->confAvg).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      + 8) -
              *(long *)&(this_00->confAvg).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data) / 0x18) * this_00->scale < confTarget) {
      this_00 = (this->feeStats)._M_t.
                super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
                super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
                super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      uVar2 = this->nBestSeenHeight;
      dVar7 = 0.1;
      if ((int)(((long)*(pointer *)
                        ((long)&(this_00->confAvg).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        + 8) -
                *(long *)&(this_00->confAvg).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data) / 0x18) * this_00->scale < confTarget) {
        this_00 = pTVar1;
      }
    }
    else {
      uVar2 = this->nBestSeenHeight;
      dVar7 = 0.5;
    }
    dVar7 = TxConfirmStats::EstimateMedianVal
                      (this_00,confTarget,dVar7,successThreshold,uVar2,result);
    if (checkShorterHorizon) {
      local_a8.pass.start = -1.0;
      local_a8.pass.end = -1.0;
      local_a8.pass.withinTarget = 0.0;
      local_a8.pass.totalConfirmed = 0.0;
      local_a8.pass.inMempool = 0.0;
      local_a8.pass.leftMempool = 0.0;
      local_a8.fail.start = -1.0;
      local_a8.fail.end = -1.0;
      local_a8.fail.withinTarget = 0.0;
      local_a8.fail.totalConfirmed = 0.0;
      local_a8.fail.inMempool = 0.0;
      local_a8.fail.leftMempool._0_4_ = 0;
      local_a8.fail.leftMempool._4_4_ = 0;
      local_a8.decay._0_4_ = 0;
      local_a8._100_8_ = 0;
      pTVar1 = (this->feeStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      uVar2 = (int)(((long)*(pointer *)
                            ((long)&(pTVar1->confAvg).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            + 8) -
                    (long)(pTVar1->confAvg).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) * pTVar1->scale;
      if ((((uVar2 < confTarget) &&
           (dVar8 = TxConfirmStats::EstimateMedianVal
                              (pTVar1,uVar2,0.1,successThreshold,this->nBestSeenHeight,&local_a8),
           0.0 < dVar8)) && (((dVar7 == -1.0 && (!NAN(dVar7))) || (dVar8 < dVar7)))) &&
         (dVar7 = dVar8, result != (EstimationResult *)0x0)) {
        pEVar4 = &local_a8;
        pEVar5 = result;
        for (lVar3 = 0x6c; lVar3 != 0; lVar3 = lVar3 + -1) {
          *(undefined1 *)&(pEVar5->pass).start = *(undefined1 *)&(pEVar4->pass).start;
          pEVar4 = (EstimationResult *)((long)pEVar4 + (ulong)bVar6 * -2 + 1);
          pEVar5 = (EstimationResult *)((long)pEVar5 + (ulong)bVar6 * -2 + 1);
        }
      }
      pTVar1 = (this->shortStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      uVar2 = (int)(((long)*(pointer *)
                            ((long)&(pTVar1->confAvg).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            + 8) -
                    (long)(pTVar1->confAvg).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) * pTVar1->scale;
      if ((((uVar2 < confTarget) &&
           (dVar8 = TxConfirmStats::EstimateMedianVal
                              (pTVar1,uVar2,0.5,successThreshold,this->nBestSeenHeight,&local_a8),
           0.0 < dVar8)) && (((dVar7 == -1.0 && (!NAN(dVar7))) || (dVar8 < dVar7)))) &&
         (dVar7 = dVar8, result != (EstimationResult *)0x0)) {
        pEVar4 = &local_a8;
        for (lVar3 = 0x6c; lVar3 != 0; lVar3 = lVar3 + -1) {
          *(undefined1 *)&(result->pass).start = *(undefined1 *)&(pEVar4->pass).start;
          pEVar4 = (EstimationResult *)((long)pEVar4 + (ulong)bVar6 * -2 + 1);
          result = (EstimationResult *)((long)result + (ulong)bVar6 * -2 + 1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return dVar7;
}

Assistant:

double CBlockPolicyEstimator::estimateCombinedFee(unsigned int confTarget, double successThreshold, bool checkShorterHorizon, EstimationResult *result) const
{
    double estimate = -1;
    if (confTarget >= 1 && confTarget <= longStats->GetMaxConfirms()) {
        // Find estimate from shortest time horizon possible
        if (confTarget <= shortStats->GetMaxConfirms()) { // short horizon
            estimate = shortStats->EstimateMedianVal(confTarget, SUFFICIENT_TXS_SHORT, successThreshold, nBestSeenHeight, result);
        }
        else if (confTarget <= feeStats->GetMaxConfirms()) { // medium horizon
            estimate = feeStats->EstimateMedianVal(confTarget, SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, result);
        }
        else { // long horizon
            estimate = longStats->EstimateMedianVal(confTarget, SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, result);
        }
        if (checkShorterHorizon) {
            EstimationResult tempResult;
            // If a lower confTarget from a more recent horizon returns a lower answer use it.
            if (confTarget > feeStats->GetMaxConfirms()) {
                double medMax = feeStats->EstimateMedianVal(feeStats->GetMaxConfirms(), SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, &tempResult);
                if (medMax > 0 && (estimate == -1 || medMax < estimate)) {
                    estimate = medMax;
                    if (result) *result = tempResult;
                }
            }
            if (confTarget > shortStats->GetMaxConfirms()) {
                double shortMax = shortStats->EstimateMedianVal(shortStats->GetMaxConfirms(), SUFFICIENT_TXS_SHORT, successThreshold, nBestSeenHeight, &tempResult);
                if (shortMax > 0 && (estimate == -1 || shortMax < estimate)) {
                    estimate = shortMax;
                    if (result) *result = tempResult;
                }
            }
        }
    }
    return estimate;
}